

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall VariationalBayesEstimatorOnLDA::updateQz(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  size_type sVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  type tVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint local_84;
  int k_1;
  double constProbability;
  double xid;
  double xik;
  double xidk;
  double xikv;
  double term4;
  double term3;
  double term2;
  double term1;
  int k;
  uint v;
  double Zq;
  int l;
  int d;
  VariationalBayesEstimatorOnLDA *this_local;
  
  Zq._4_4_ = 0;
  while( true ) {
    sVar6 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(this->_docVoca);
    if (sVar6 <= (ulong)(long)Zq._4_4_) break;
    Zq._0_4_ = 0;
    while( true ) {
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)Zq._4_4_);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
      if (sVar6 <= (ulong)(long)Zq._0_4_) break;
      _k = 0.0;
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)Zq._4_4_);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar7,(long)Zq._0_4_);
      uVar5 = *pvVar8;
      for (term1._0_4_ = 0; term1._0_4_ < this->_K; term1._0_4_ = term1._0_4_ + 1) {
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->_nkv,(long)(int)term1._0_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(ulong)uVar5);
        dVar13 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->_beta,(ulong)uVar5);
        dVar14 = *pvVar10;
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->_ndk,(long)Zq._4_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar9,(long)(int)term1._0_4_);
        dVar15 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->_alpha,(long)(int)term1._0_4_);
        dVar16 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->_nk,(long)(int)term1._0_4_);
        dVar1 = *pvVar10;
        dVar2 = this->_betaSum;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->_nd,(long)Zq._4_4_);
        dVar3 = *pvVar10;
        dVar4 = this->_alphaSum;
        tVar12 = boost::math::digamma<double>(dVar13 + dVar14);
        dVar13 = exp(tVar12);
        tVar12 = boost::math::digamma<double>(dVar15 + dVar16);
        dVar14 = exp(tVar12);
        tVar12 = boost::math::digamma<double>(dVar1 + dVar2);
        dVar15 = exp(tVar12);
        tVar12 = boost::math::digamma<double>(dVar3 + dVar4);
        dVar16 = exp(tVar12);
        dVar13 = (dVar13 * dVar14) / (dVar15 * dVar16);
        _k = dVar13 + _k;
        pvVar11 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->_qz,(long)Zq._4_4_);
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar11,(long)Zq._0_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar9,(long)(int)term1._0_4_);
        *pvVar10 = dVar13;
      }
      for (local_84 = 0; local_84 < this->_K; local_84 = local_84 + 1) {
        pvVar11 = std::
                  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                  ::operator[](&this->_qz,(long)Zq._4_4_);
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar11,(long)Zq._0_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar9,(long)(int)local_84);
        *pvVar10 = *pvVar10 / _k;
      }
      Zq._0_4_ = Zq._0_4_ + 1;
    }
    Zq._4_4_ = Zq._4_4_ + 1;
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateQz(){//{{{
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            double Zq = 0;
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                double term1 = 0, term2 = 0, term3 = 0, term4 = 0;
                double xikv = _nkv[k][v] + _beta[v];
                double xidk = _ndk[d][k] + _alpha[k];
                double xik = _nk[k] + _betaSum;
                double xid = _nd[d] + _alphaSum;
                try{
                    term1 = exp(boost::math::digamma(xikv));
                }catch(...){
                    term1 = 0;
                }
                try{
                    term2 = exp(boost::math::digamma(xidk));
                }catch(...){
                    term2 = 0;
                }
                try{
                    term3 = exp(boost::math::digamma(xik));
                }catch(...){
                    term3 = 0;
                }
                try{
                    term4 = exp(boost::math::digamma(xid));
                }catch(...){
                    term4 = 0;
                }
                double constProbability = (term1 * term2) / (term3 * term4);
                Zq += constProbability;
                _qz[d][l][k] = constProbability;
            }
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= Zq;
            }
        }
    }
}